

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SearchableObjectHolder.hpp
# Opt level: O0

shared_ptr<helics::Broker> __thiscall
gmlc::concurrency::SearchableObjectHolder<helics::Broker,_helics::CoreType>::findObject
          (SearchableObjectHolder<helics::Core,_helics::CoreType> *this,
          function<bool_(const_std::shared_ptr<helics::Broker>_&)> *operand)

{
  bool bVar1;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Broker>_>_>
  in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<helics::Broker> *in_RDI;
  anon_class_8_1_38113ba9_for__M_pred __pred;
  shared_ptr<helics::Broker> sVar2;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Broker>_>_>
  obj;
  lock_guard<std::mutex> lock;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Broker>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Broker>_>_>_>
  *in_stack_ffffffffffffff68;
  shared_ptr<helics::Broker> *this_00;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Broker>_>_>
  in_stack_ffffffffffffff98;
  _Self local_58 [4];
  _Base_ptr local_38;
  _Base_ptr local_30;
  _Self local_28 [5];
  
  this_00 = in_RDI;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_RDI,(mutex_type *)in_stack_ffffffffffffff68);
  __pred.operand = (function<bool_(const_std::shared_ptr<helics::Broker>_&)> *)(in_RSI + 0x28);
  local_30 = (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Broker>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Broker>_>_>_>
             ::begin(in_stack_ffffffffffffff68);
  local_38 = (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Broker>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Broker>_>_>_>
             ::end(in_stack_ffffffffffffff68);
  local_28[0]._M_node =
       (_Base_ptr)
       std::
       find_if<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<helics::Broker>>>,gmlc::concurrency::SearchableObjectHolder<helics::Broker,helics::CoreType>::findObject(std::function<bool(std::shared_ptr<helics::Broker>const&)>)::_lambda(auto:1&)_1_>
                 (in_stack_ffffffffffffff98,in_RDX,__pred);
  local_58[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Broker>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Broker>_>_>_>
       ::end(in_stack_ffffffffffffff68);
  bVar1 = std::operator==(local_28,local_58);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::shared_ptr<helics::Broker>::shared_ptr(this_00,in_stack_ffffffffffffff68);
  }
  else {
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Broker>_>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Broker>_>_>
                  *)0x5241b2);
    std::shared_ptr<helics::Broker>::shared_ptr
              (this_00,(shared_ptr<helics::Broker> *)in_stack_ffffffffffffff68);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x524207);
  sVar2.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (shared_ptr<helics::Broker>)
         sVar2.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<X>
        findObject(std::function<bool(const std::shared_ptr<X>&)> operand)
    {
        std::lock_guard<std::mutex> lock(mapLock);
        auto obj =
            std::find_if(objectMap.begin(),
                         objectMap.end(),
                         [&operand](auto& val) { return operand(val.second); });
        if (obj != objectMap.end()) {
            return obj->second;
        }
        return nullptr;
    }